

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

HFSubConsumer * __thiscall
MlmWrap::createConsumerSub(MlmWrap *this,HighFreqDataType *dt,size_t messageBufferLength)

{
  SubType SVar1;
  HFSubConsumer *this_00;
  undefined8 in_RSI;
  hfs_data_callback_fn in_RDI;
  HFSubSockSettings sockInfo;
  HFSubConsumer *newSub;
  HighFreqSub *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  SubType type;
  HFSubConsumer *hf;
  HFSubSockSettings *in_stack_fffffffffffffd60;
  HighFreqDataType *in_stack_fffffffffffffd68;
  HighFreqDataType *in_stack_fffffffffffffd70;
  consumer_queue_filter in_stack_fffffffffffffe08;
  size_t in_stack_fffffffffffffe10;
  HighFreqDataType *in_stack_fffffffffffffe18;
  HFSubConsumer *in_stack_fffffffffffffe20;
  HFSubSockSettings *in_stack_fffffffffffffe40;
  MlmWrap *in_stack_fffffffffffffe48;
  
  type = (SubType)((ulong)in_RSI >> 0x20);
  this_00 = (HFSubConsumer *)operator_new(0x3c8);
  HighFreqDataType::HighFreqDataType(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  HFSubConsumer::HFSubConsumer
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08);
  HighFreqDataType::~HighFreqDataType
            ((HighFreqDataType *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  hf = this_00;
  addSubToList((MlmWrap *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
               in_stack_fffffffffffffd38);
  HighFreqDataType::HighFreqDataType(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  SVar1 = HighFreqSub::getSubSockType(&this_00->super_HighFreqSub);
  HFSubSockSettings::HFSubSockSettings
            (in_stack_fffffffffffffd60,(HighFreqDataType *)hf,type,in_RDI,
             (void *)CONCAT44(SVar1,in_stack_fffffffffffffd40));
  HighFreqDataType::~HighFreqDataType((HighFreqDataType *)CONCAT44(SVar1,in_stack_fffffffffffffd40))
  ;
  HFSubSockSettings::HFSubSockSettings
            ((HFSubSockSettings *)CONCAT44(SVar1,in_stack_fffffffffffffd40),
             (HFSubSockSettings *)in_stack_fffffffffffffd38);
  addHfTypeToSubbedList(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  HFSubSockSettings::~HFSubSockSettings((HFSubSockSettings *)0x1f5ca7);
  HFSubSockSettings::~HFSubSockSettings((HFSubSockSettings *)0x1f5cc0);
  return this_00;
}

Assistant:

HFSubConsumer* MlmWrap::createConsumerSub(HighFreqDataType dt, size_t messageBufferLength){
//    std::cout << "creating subscriber \n";
    HFSubConsumer *newSub = new HFSubConsumer(dt, messageBufferLength);
    addSubToList(newSub);

    HFSubSockSettings sockInfo(dt, newSub->getSubSockType(), NULL, NULL);
    addHfTypeToSubbedList(sockInfo);
    //todo: add a check to see if newSub was created properly, if not, don't add the type to the subbedList

    return newSub;
}